

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O2

WatchID __thiscall
efsw::FileWatcherInotify::addWatch
          (FileWatcherInotify *this,string *directory,FileWatchListener *watcher,bool recursive,
          vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options)

{
  int iVar1;
  Error EVar2;
  WatchID WVar3;
  Lock initLock;
  string local_48;
  
  if (((this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i & 1U) == 0) {
    std::__cxx11::string::string((string *)&local_48,(string *)directory);
    EVar2 = Errors::Log::createLastError(Unspecified,&local_48);
    WVar3 = (WatchID)EVar2;
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    initLock.mMutex = &this->mInitLock;
    Mutex::lock(initLock.mMutex);
    iVar1 = FileWatcherImpl::getOptionValue
                      (&this->super_FileWatcherImpl,options,LinuxProduceSyntheticEvents,0);
    WVar3 = addWatch(this,directory,watcher,recursive,iVar1 != 0,(WatcherInotify *)0x0,false);
    Lock::~Lock(&initLock);
  }
  return WVar3;
}

Assistant:

WatchID FileWatcherInotify::addWatch( const std::string& directory, FileWatchListener* watcher,
									  bool recursive, const std::vector<WatcherOption>& options ) {
	if ( !mInitOK )
		return Errors::Log::createLastError( Errors::Unspecified, directory );
	Lock initLock( mInitLock );
	bool syntheticEvents = getOptionValue( options, Options::LinuxProduceSyntheticEvents, 0 ) != 0;
	return addWatch( directory, watcher, recursive, syntheticEvents, NULL );
}